

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ApiSetAuxdata(Fts5Context *pCtx,void *pPtr,_func_void_void_ptr *xDelete)

{
  int iVar1;
  long *plVar2;
  Fts5Context *pFVar3;
  long in_FS_OFFSET;
  int rc;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = pCtx + 0x98;
  do {
    plVar2 = *(long **)pFVar3;
    if (plVar2 == (long *)0x0) {
      rc = 0;
      plVar2 = (long *)sqlite3Fts5MallocZero(&rc,0x20);
      if (plVar2 == (long *)0x0) {
        iVar1 = rc;
        if (xDelete != (_func_void_void_ptr *)0x0) {
          (*xDelete)(pPtr);
          iVar1 = rc;
        }
      }
      else {
        *plVar2 = *(long *)(pCtx + 0x90);
        plVar2[3] = *(long *)(pCtx + 0x98);
        *(long **)(pCtx + 0x98) = plVar2;
LAB_001cf3db:
        plVar2[2] = (long)xDelete;
        plVar2[1] = (long)pPtr;
        iVar1 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return iVar1;
    }
    if (*plVar2 == *(long *)(pCtx + 0x90)) {
      if ((code *)plVar2[2] != (code *)0x0) {
        (*(code *)plVar2[2])(plVar2[1]);
      }
      goto LAB_001cf3db;
    }
    pFVar3 = (Fts5Context *)(plVar2 + 3);
  } while( true );
}

Assistant:

static int fts5ApiSetAuxdata(
  Fts5Context *pCtx,              /* Fts5 context */
  void *pPtr,                     /* Pointer to save as auxdata */
  void(*xDelete)(void*)           /* Destructor for pPtr (or NULL) */
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;

  /* Search through the cursors list of Fts5Auxdata objects for one that
  ** corresponds to the currently executing auxiliary function.  */
  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    if( pData->xDelete ){
      pData->xDelete(pData->pPtr);
    }
  }else{
    int rc = SQLITE_OK;
    pData = (Fts5Auxdata*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5Auxdata));
    if( pData==0 ){
      if( xDelete ) xDelete(pPtr);
      return rc;
    }
    pData->pAux = pCsr->pAux;
    pData->pNext = pCsr->pAuxdata;
    pCsr->pAuxdata = pData;
  }

  pData->xDelete = xDelete;
  pData->pPtr = pPtr;
  return SQLITE_OK;
}